

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

value * __thiscall
mjs::anon_unknown_35::encode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  int ch;
  gc_heap *this_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  conversion_result cVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t buffer [4];
  wstring res;
  byte local_84 [4];
  gc_heap_ptr_untyped local_80;
  gc_heap_ptr<mjs::global_object> *local_70;
  wstring local_68;
  value *local_48;
  wstring_view local_40;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = L'\0';
  uVar6 = 0;
  local_70 = global;
  if ((int)global != 0) {
    local_48 = __return_storage_ptr__;
    do {
      ch = *(int *)(s._M_len + uVar6 * 4);
      bVar1 = anon_unknown_5::is_uri_unescaped(ch);
      if (bVar1) {
LAB_0013d4dc:
        cVar4.length = 1;
        cVar4.code_point = L'\0';
        std::__cxx11::wstring::push_back((wchar_t)&local_68);
      }
      else {
        local_80.heap_._0_1_ = (undefined1)ch;
        pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (";/?:@&=+$,","",&local_80);
        if ((ch == 0x23) || (pcVar3 != "")) goto LAB_0013d4dc;
        cVar4 = unicode::utf16_to_utf32<wchar_t>
                          ((wchar_t *)(s._M_len + uVar6 * 4),(int)global - (int)uVar6);
        if (cVar4.length == 0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = &PTR__exception_001d51e8;
          __cxa_throw(puVar5,&(anonymous_namespace)::(anonymous_namespace)::encoder_exception::
                              typeinfo,std::exception::~exception);
        }
        uVar2 = unicode::utf32_to_utf8<unsigned_char>(cVar4.code_point,local_84);
        if (uVar2 == 0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = &PTR__exception_001d51e8;
          __cxa_throw(puVar5,&(anonymous_namespace)::(anonymous_namespace)::encoder_exception::
                              typeinfo,std::exception::~exception);
        }
        uVar7 = 0;
        do {
          anon_unknown_5::put_percent_hex_byte(&local_68,(uint)local_84[uVar7]);
          uVar7 = uVar7 + 1;
          global = local_70;
        } while (uVar2 != uVar7);
      }
      uVar2 = (int)uVar6 + cVar4.length;
      uVar6 = (ulong)uVar2;
      __return_storage_ptr__ = local_48;
    } while (uVar2 < (uint)global);
  }
  local_40._M_len = local_68._M_string_length;
  local_40._M_str = local_68._M_dataplus._M_p;
  string::string((string *)&local_80,*(gc_heap **)this,&local_40);
  __return_storage_ptr__->type_ = string;
  this_00 = (gc_heap *)CONCAT71(local_80.heap_._1_7_,local_80.heap_._0_1_);
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = this_00;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_80.pos_;
  if (this_00 != (gc_heap *)0x0) {
    gc_heap::attach(this_00,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT44(local_68.field_2._M_local_buf[1],local_68.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

value encode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    return encode_uri_helper(global, s, [](int ch) { return is_uri_unescaped(ch) || is_uri_reserved(ch) || ch == '#'; } );
}